

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

void __thiscall
duckdb::RowGroupCollection::InitializeScan
          (RowGroupCollection *this,CollectionScanState *state,
          vector<duckdb::StorageIndex,_true> *column_ids,
          optional_ptr<duckdb::TableFilterSet,_true> table_filters)

{
  bool bVar1;
  RowGroupSegmentTree *pRVar2;
  RowGroup *this_00;
  
  pRVar2 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
  this_00 = SegmentTree<duckdb::RowGroup,_true>::GetRootSegment
                      (&pRVar2->super_SegmentTree<duckdb::RowGroup,_true>);
  state->row_groups =
       (this->row_groups).internal.
       super___shared_ptr<duckdb::RowGroupSegmentTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  state->max_row = (this->total_rows).super___atomic_base<unsigned_long>._M_i + this->row_start;
  CollectionScanState::Initialize(state,&this->types);
  while( true ) {
    if (this_00 == (RowGroup *)0x0) {
      return;
    }
    bVar1 = RowGroup::InitializeScan(this_00,state);
    if (bVar1) break;
    pRVar2 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
    this_00 = SegmentTree<duckdb::RowGroup,_true>::GetNextSegment
                        (&pRVar2->super_SegmentTree<duckdb::RowGroup,_true>,this_00);
  }
  return;
}

Assistant:

void RowGroupCollection::InitializeScan(CollectionScanState &state, const vector<StorageIndex> &column_ids,
                                        optional_ptr<TableFilterSet> table_filters) {
	auto row_group = row_groups->GetRootSegment();
	D_ASSERT(row_group);
	state.row_groups = row_groups.get();
	state.max_row = row_start + total_rows;
	state.Initialize(GetTypes());
	while (row_group && !row_group->InitializeScan(state)) {
		row_group = row_groups->GetNextSegment(row_group);
	}
}